

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O1

void __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
checkCharacterImmediatelyAfterLiteral
          (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           *this)

{
  char *pcVar1;
  UnicodeChar UVar2;
  CompileMessage local_48;
  
  pcVar1 = (this->input).data;
  if ((((9 < (byte)(*pcVar1 - 0x30U)) &&
       (UVar2 = UTF8Reader::operator*(&this->input), 9 < UVar2 - 0x30)) && (UVar2 != 0x5f)) &&
     (0x19 < (UVar2 & 0xffffffdf) - 0x41)) {
    return;
  }
  (this->location).location.data = pcVar1;
  CompileMessageHelpers::createMessage<>(&local_48,syntax,error,"Unrecognised suffix on literal");
  (*this->_vptr_Tokeniser[2])(this,&local_48);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_48.location.sourceCode.object);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.description._M_dataplus._M_p != &local_48.description.field_2) {
    operator_delete(local_48.description._M_dataplus._M_p,
                    local_48.description.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void checkCharacterImmediatelyAfterLiteral()
    {
        if (input.isDigit() || IdentifierMatcher::isIdentifierBody (*input))
        {
            location.location = input;
            throwError (Errors::unrecognisedLiteralSuffix());
        }
    }